

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void basic_test(service *srv,bool throws)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  runtime_error *prVar4;
  byte in_SIL;
  service *in_RDI;
  ostringstream oss_24;
  ostringstream oss_23;
  ostringstream oss_22;
  cppcms_error *e_5;
  ostringstream oss_21;
  cppcms_error *e_4;
  ostringstream oss_20;
  cppcms_error *e_3;
  ostringstream oss_19;
  cppcms_error *e_2;
  ostringstream oss_18;
  ostringstream oss_17;
  cppcms_error *e_1;
  ostringstream oss_16;
  ostringstream oss_15;
  cppcms_error *e;
  ostringstream oss_14;
  ostringstream oss_13;
  ostringstream oss_12;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream ss;
  ostringstream oss;
  url_mapper m;
  application app;
  char *in_stack_ffffffffffffc388;
  streamable *psVar5;
  streamable *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc390;
  int *in_stack_ffffffffffffc3a8;
  streamable *in_stack_ffffffffffffc3b0;
  ostringstream *in_stack_ffffffffffffc3e8;
  string local_2318 [32];
  ostringstream local_22f8 [383];
  allocator local_2179;
  string local_2178 [39];
  allocator local_2151;
  string local_2150 [39];
  undefined1 local_2129;
  string local_2128 [32];
  ostringstream local_2108 [376];
  string local_1f90 [36];
  undefined4 local_1f6c;
  streamable local_1f68;
  undefined1 local_1f41;
  string local_1f40 [32];
  ostringstream local_1f20 [376];
  string local_1da8 [36];
  undefined4 local_1d84;
  streamable local_1d80;
  allocator local_1d59;
  string local_1d58 [39];
  undefined1 local_1d31;
  string local_1d30 [32];
  ostringstream local_1d10 [376];
  string local_1b98 [32];
  streamable local_1b78;
  undefined4 local_1b54;
  streamable local_1b50;
  undefined1 local_1b29;
  string local_1b28 [32];
  ostringstream local_1b08 [376];
  string local_1990 [36];
  undefined4 local_196c;
  streamable local_1968;
  undefined1 local_1941;
  string local_1940 [32];
  ostringstream local_1920 [376];
  string local_17a8 [36];
  undefined4 local_1784;
  streamable local_1780;
  streamable local_1760;
  streamable local_1740;
  undefined4 local_171c;
  streamable local_1718;
  undefined1 local_16f1;
  string local_16f0 [32];
  ostringstream local_16d0 [376];
  string local_1558 [36];
  undefined4 local_1534;
  streamable local_1530;
  undefined4 local_150c;
  streamable local_1508;
  undefined4 local_14e4;
  streamable local_14e0;
  undefined4 local_14bc;
  streamable local_14b8;
  undefined4 local_1494;
  streamable local_1490;
  undefined4 local_146c;
  streamable local_1468;
  undefined1 local_1441;
  string local_1440 [32];
  ostringstream local_1420 [376];
  string local_12a8 [36];
  undefined4 local_1284;
  streamable local_1280;
  undefined4 local_125c;
  streamable local_1258;
  undefined4 local_1234;
  streamable local_1230;
  undefined4 local_120c;
  streamable local_1208;
  undefined4 local_11e4;
  streamable local_11e0;
  undefined1 local_11b9;
  string local_11b8 [32];
  ostringstream local_1198 [376];
  string local_1020 [36];
  undefined4 local_ffc;
  streamable local_ff8;
  undefined4 local_fd4;
  streamable local_fd0;
  undefined4 local_fac;
  streamable local_fa8;
  undefined4 local_f84;
  streamable local_f80;
  undefined1 local_f59;
  string local_f58 [32];
  ostringstream local_f38 [376];
  string local_dc0 [36];
  undefined4 local_d9c;
  streamable local_d98;
  undefined4 local_d74;
  streamable local_d70;
  undefined4 local_d4c;
  streamable local_d48;
  undefined1 local_d21;
  string local_d20 [32];
  ostringstream local_d00 [376];
  string local_b88 [36];
  undefined4 local_b64;
  streamable local_b60;
  undefined4 local_b3c;
  streamable local_b38;
  undefined1 local_b11;
  string local_b10 [32];
  ostringstream local_af0 [376];
  string local_978 [36];
  undefined4 local_954;
  streamable local_950;
  undefined1 local_929;
  string local_928 [32];
  ostringstream local_908 [376];
  string local_790 [32];
  ostringstream local_770 [383];
  undefined1 local_5f1;
  string local_5f0 [32];
  ostringstream local_5d0 [376];
  string local_458 [39];
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [39];
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [48];
  url_mapper local_40 [8];
  application local_38 [47];
  byte local_9;
  
  local_9 = in_SIL & 1;
  cppcms::application::application(local_38,in_RDI);
  cppcms::url_mapper::url_mapper(local_40,local_38);
  poVar2 = std::operator<<((ostream *)&std::cout,"-- Basic Mapping");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"foo",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"/foo",&local_99);
  cppcms::url_mapper::assign((string *)local_40,local_70);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"foo",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"/foo/{1}",&local_e9);
  cppcms::url_mapper::assign((string *)local_40,local_c0);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"foo",&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"/foo/{1}/{2}",&local_139);
  cppcms::url_mapper::assign((string *)local_40,local_110);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"foo",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"/foo/{1}/{2}/{3}",&local_189);
  cppcms::url_mapper::assign((string *)local_40,local_160);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"foo",&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"/foo/{1}/{2}/{3}/{4}",&local_1d9);
  cppcms::url_mapper::assign((string *)local_40,local_1b0);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"foo",&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"/foo/{1}/{2}/{3}/{4}/{5}",&local_229);
  cppcms::url_mapper::assign((string *)local_40,local_200);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"foo",&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"/foo/{1}/{2}/{3}/{4}/{5}/{6}",&local_279);
  cppcms::url_mapper::assign((string *)local_40,local_250);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"bar",&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"/bar/{lang}/{1}",&local_2c9);
  cppcms::url_mapper::assign((string *)local_40,local_2a0);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"bar",&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"/bar/{2}/{1}",&local_319);
  cppcms::url_mapper::assign((string *)local_40,local_2f0);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"test1",&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"{1}x",&local_369);
  cppcms::url_mapper::assign((string *)local_40,local_340);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"test2",&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"x{1}",&local_3b9);
  cppcms::url_mapper::assign((string *)local_40,local_390);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  psVar3 = (string *)cppcms::application::mapper();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"lang",&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"en",&local_409);
  cppcms::url_mapper::set_value(psVar3,local_3e0);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"test.com",&local_431);
  cppcms::url_mapper::root((string *)local_40);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  cppcms::url_mapper::root_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffc390,in_stack_ffffffffffffc388);
  std::__cxx11::string::~string(local_458);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_5d0);
    poVar2 = std::operator<<((ostream *)local_5d0,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x160);
    std::operator<<(poVar2," m.root()==\"test.com\"");
    local_5f1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_5f0);
    local_5f1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_770);
  cppcms::url_mapper::map((ostream *)local_40,(char *)local_770);
  value(in_stack_ffffffffffffc3e8);
  bVar1 = std::operator==(in_stack_ffffffffffffc390,in_stack_ffffffffffffc388);
  std::__cxx11::string::~string(local_790);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_908);
    poVar2 = std::operator<<((ostream *)local_908,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x164);
    std::operator<<(poVar2," value(ss) == \"test.com/foo\"");
    local_929 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_928);
    local_929 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_954 = 1;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  cppcms::url_mapper::map((ostream *)local_40,(char *)local_770,(streamable *)0x16a111);
  cppcms::filters::streamable::~streamable(&local_950);
  value(in_stack_ffffffffffffc3e8);
  bVar1 = std::operator==(in_stack_ffffffffffffc390,in_stack_ffffffffffffc388);
  std::__cxx11::string::~string(local_978);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_af0);
    poVar2 = std::operator<<((ostream *)local_af0,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x168);
    std::operator<<(poVar2," value(ss) == \"test.com/foo/1\"");
    local_b11 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_b10);
    local_b11 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_b3c = 1;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  local_b64 = 2;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  cppcms::url_mapper::map((ostream *)local_40,(char *)local_770,(streamable *)0x16a111,&local_b38);
  cppcms::filters::streamable::~streamable(&local_b60);
  cppcms::filters::streamable::~streamable(&local_b38);
  value(in_stack_ffffffffffffc3e8);
  bVar1 = std::operator==(in_stack_ffffffffffffc390,in_stack_ffffffffffffc388);
  std::__cxx11::string::~string(local_b88);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_d00);
    poVar2 = std::operator<<((ostream *)local_d00,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x16a);
    std::operator<<(poVar2," value(ss) == \"test.com/foo/1/2\"");
    local_d21 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_d20);
    local_d21 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_d4c = 1;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  local_d74 = 2;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  local_d9c = 3;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  cppcms::url_mapper::map
            ((ostream *)local_40,(char *)local_770,(streamable *)0x16a111,&local_d48,&local_d70);
  cppcms::filters::streamable::~streamable(&local_d98);
  cppcms::filters::streamable::~streamable(&local_d70);
  cppcms::filters::streamable::~streamable(&local_d48);
  value(in_stack_ffffffffffffc3e8);
  bVar1 = std::operator==(in_stack_ffffffffffffc390,in_stack_ffffffffffffc388);
  std::__cxx11::string::~string(local_dc0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_f38);
    poVar2 = std::operator<<((ostream *)local_f38,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x16c);
    std::operator<<(poVar2," value(ss) == \"test.com/foo/1/2/3\"");
    local_f59 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_f58);
    local_f59 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_f84 = 1;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  local_fac = 2;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  local_fd4 = 3;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  local_ffc = 4;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  psVar5 = &local_ff8;
  cppcms::url_mapper::map
            ((ostream *)local_40,(char *)local_770,(streamable *)0x16a111,&local_f80,&local_fa8,
             &local_fd0);
  cppcms::filters::streamable::~streamable(&local_ff8);
  cppcms::filters::streamable::~streamable(&local_fd0);
  cppcms::filters::streamable::~streamable(&local_fa8);
  cppcms::filters::streamable::~streamable(&local_f80);
  value(in_stack_ffffffffffffc3e8);
  bVar1 = std::operator==(in_stack_ffffffffffffc390,(char *)psVar5);
  std::__cxx11::string::~string(local_1020);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1198);
    poVar2 = std::operator<<((ostream *)local_1198,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x16e);
    std::operator<<(poVar2," value(ss) == \"test.com/foo/1/2/3/4\"");
    local_11b9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_11b8);
    local_11b9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_11e4 = 1;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  local_120c = 2;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  local_1234 = 3;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  local_125c = 4;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  local_1284 = 5;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  psVar5 = &local_1280;
  psVar6 = &local_1258;
  cppcms::url_mapper::map
            ((ostream *)local_40,(char *)local_770,(streamable *)0x16a111,&local_11e0,&local_1208,
             &local_1230,psVar6);
  cppcms::filters::streamable::~streamable(&local_1280);
  cppcms::filters::streamable::~streamable(&local_1258);
  cppcms::filters::streamable::~streamable(&local_1230);
  cppcms::filters::streamable::~streamable(&local_1208);
  cppcms::filters::streamable::~streamable(&local_11e0);
  value(in_stack_ffffffffffffc3e8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          psVar5,(char *)psVar6);
  std::__cxx11::string::~string(local_12a8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1420);
    poVar2 = std::operator<<((ostream *)local_1420,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x170);
    std::operator<<(poVar2," value(ss) == \"test.com/foo/1/2/3/4/5\"");
    local_1441 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1440);
    local_1441 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_146c = 1;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  local_1494 = 2;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  local_14bc = 3;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  local_14e4 = 4;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  local_150c = 5;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  local_1534 = 6;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  psVar5 = &local_1508;
  psVar6 = &local_14e0;
  cppcms::url_mapper::map
            ((ostream *)local_40,(char *)local_770,(streamable *)0x16a111,&local_1468,&local_1490,
             &local_14b8,psVar6,psVar5);
  cppcms::filters::streamable::~streamable(&local_1530);
  cppcms::filters::streamable::~streamable(&local_1508);
  cppcms::filters::streamable::~streamable(&local_14e0);
  cppcms::filters::streamable::~streamable(&local_14b8);
  cppcms::filters::streamable::~streamable(&local_1490);
  cppcms::filters::streamable::~streamable(&local_1468);
  value(in_stack_ffffffffffffc3e8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          psVar5,(char *)psVar6);
  std::__cxx11::string::~string(local_1558);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_16d0);
    poVar2 = std::operator<<((ostream *)local_16d0,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x172);
    std::operator<<(poVar2," value(ss) == \"test.com/foo/1/2/3/4/5/6\"");
    local_16f1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_16f0);
    local_16f1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_171c = 1;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  cppcms::filters::streamable::streamable(&local_1740,"a");
  cppcms::filters::streamable::streamable(&local_1760,"b");
  local_1784 = 5;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  psVar6 = &local_1780;
  cppcms::url_mapper::map
            ((ostream *)local_40,(char *)local_770,(streamable *)0x16a111,&local_1718,&local_1740,
             &local_1760);
  cppcms::filters::streamable::~streamable(&local_1780);
  cppcms::filters::streamable::~streamable(&local_1760);
  cppcms::filters::streamable::~streamable(&local_1740);
  cppcms::filters::streamable::~streamable(&local_1718);
  value(in_stack_ffffffffffffc3e8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          psVar5,(char *)psVar6);
  std::__cxx11::string::~string(local_17a8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1920);
    poVar2 = std::operator<<((ostream *)local_1920,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x175);
    std::operator<<(poVar2," value(ss) == \"test.com/foo/1/a/b/5\"");
    local_1941 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1940);
    local_1941 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_196c = 1;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  cppcms::url_mapper::map((ostream *)local_40,(char *)local_770,(streamable *)0x169611);
  cppcms::filters::streamable::~streamable(&local_1968);
  value(in_stack_ffffffffffffc3e8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          psVar5,(char *)psVar6);
  std::__cxx11::string::~string(local_1990);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1b08);
    poVar2 = std::operator<<((ostream *)local_1b08,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x178);
    std::operator<<(poVar2," value(ss) == \"test.com/bar/en/1\"");
    local_1b29 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1b28);
    local_1b29 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1b54 = 1;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  cppcms::filters::streamable::streamable(&local_1b78,"ru");
  cppcms::url_mapper::map((ostream *)local_40,(char *)local_770,(streamable *)0x169611,&local_1b50);
  cppcms::filters::streamable::~streamable(&local_1b78);
  cppcms::filters::streamable::~streamable(&local_1b50);
  value(in_stack_ffffffffffffc3e8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          psVar5,(char *)psVar6);
  std::__cxx11::string::~string(local_1b98);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1d10);
    poVar2 = std::operator<<((ostream *)local_1d10,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x17a);
    std::operator<<(poVar2," value(ss) == \"test.com/bar/ru/1\"");
    local_1d31 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1d30);
    local_1d31 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d58,"",&local_1d59);
  cppcms::url_mapper::root((string *)local_40);
  std::__cxx11::string::~string(local_1d58);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d59);
  local_1d84 = 10;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  cppcms::url_mapper::map((ostream *)local_40,(char *)local_770,(streamable *)"test1");
  cppcms::filters::streamable::~streamable(&local_1d80);
  value(in_stack_ffffffffffffc3e8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          psVar5,(char *)psVar6);
  std::__cxx11::string::~string(local_1da8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1f20);
    poVar2 = std::operator<<((ostream *)local_1f20,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x17d);
    std::operator<<(poVar2," value(ss) == \"10x\"");
    local_1f41 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1f40);
    local_1f41 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1f6c = 10;
  cppcms::filters::streamable::streamable<int>(in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
  cppcms::url_mapper::map((ostream *)local_40,(char *)local_770,(streamable *)"test2");
  cppcms::filters::streamable::~streamable(&local_1f68);
  value(in_stack_ffffffffffffc3e8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          psVar5,(char *)psVar6);
  std::__cxx11::string::~string(local_1f90);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2108);
    poVar2 = std::operator<<((ostream *)local_2108,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x17f);
    std::operator<<(poVar2," value(ss) == \"x10\"");
    local_2129 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_2128);
    local_2129 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"-- Testing throwing at invalid params");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2150,"x",&local_2151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2178,"a{",&local_2179);
  cppcms::url_mapper::assign((string *)local_40,local_2150);
  std::__cxx11::string::~string(local_2178);
  std::allocator<char>::~allocator((allocator<char> *)&local_2179);
  std::__cxx11::string::~string(local_2150);
  std::allocator<char>::~allocator((allocator<char> *)&local_2151);
  std::__cxx11::ostringstream::ostringstream(local_22f8);
  poVar2 = std::operator<<((ostream *)local_22f8,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x184);
  std::operator<<(poVar2," 0");
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar4,local_2318);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void basic_test(cppcms::service &srv,bool throws)
{
	cppcms::application app(srv);
	cppcms::url_mapper m(&app);

	std::cout << "-- Basic Mapping" << std::endl;

	m.assign("foo","/foo");
	m.assign("foo","/foo/{1}");
	m.assign("foo","/foo/{1}/{2}");
	m.assign("foo","/foo/{1}/{2}/{3}");
	m.assign("foo","/foo/{1}/{2}/{3}/{4}");
	m.assign("foo","/foo/{1}/{2}/{3}/{4}/{5}");
	m.assign("foo","/foo/{1}/{2}/{3}/{4}/{5}/{6}");
	m.assign("bar","/bar/{lang}/{1}");
	m.assign("bar","/bar/{2}/{1}");
	m.assign("test1","{1}x");
	m.assign("test2","x{1}");
	app.mapper().set_value("lang","en");
	m.root("test.com");
	TEST(m.root()=="test.com");

	std::ostringstream ss;
	m.map(ss,"foo");
	TEST(value(ss) == "test.com/foo");


	m.map(ss,"foo",1);
	TEST(value(ss) == "test.com/foo/1");
	m.map(ss,"foo",1,2);
	TEST(value(ss) == "test.com/foo/1/2");
	m.map(ss,"foo",1,2,3);
	TEST(value(ss) == "test.com/foo/1/2/3");
	m.map(ss,"foo",1,2,3,4);
	TEST(value(ss) == "test.com/foo/1/2/3/4");
	m.map(ss,"foo",1,2,3,4,5);
	TEST(value(ss) == "test.com/foo/1/2/3/4/5");
	m.map(ss,"foo",1,2,3,4,5,6);
	TEST(value(ss) == "test.com/foo/1/2/3/4/5/6");

	m.map(ss,"foo",1,"a","b",5);
	TEST(value(ss) == "test.com/foo/1/a/b/5");
	
	m.map(ss,"bar",1);
	TEST(value(ss) == "test.com/bar/en/1");
	m.map(ss,"bar",1,"ru");
	TEST(value(ss) == "test.com/bar/ru/1");
	m.root("");
	m.map(ss,"test1",10);
	TEST(value(ss) == "10x");
	m.map(ss,"test2",10);
	TEST(value(ss) == "x10");

	std::cout << "-- Testing throwing at invalid params" << std::endl;
	try {
		m.assign("x","a{");
		TEST(0);
	}
	catch(cppcms::cppcms_error const &e) {}
	catch(...) { TEST(0); }

	try {
		m.assign("x","a}");
		TEST(0);
	}
	catch(cppcms::cppcms_error const &e) {}
	catch(...) { TEST(0); }
	
	try {
		m.assign("x","a{0}");
		TEST(0);
	}
	catch(cppcms::cppcms_error const &e) {}
	catch(...) { TEST(0); }

	if(throws) {
		try {
			m.map(ss,"undefined");
			TEST(!"Should not be there");
		}
		catch(cppcms::cppcms_error const &e) {}
		
		try {
			m.map(ss,"undefined");
			TEST(!"Should not be there");
		}
		catch(cppcms::cppcms_error const &e) {}
		
		try {
			m.map(ss,"test1",1,2);
			TEST(!"Should not be there");
		}
		catch(cppcms::cppcms_error const &e) {}
	}
	else {

		m.map(ss,"undefined");
		TEST(value(ss)=="/this_is_an_invalid_url_generated_by_url_mapper");

		m.map(ss,"undefined");
		TEST(value(ss)=="/this_is_an_invalid_url_generated_by_url_mapper");

		m.map(ss,"test1",1,2);
		TEST(value(ss)=="/this_is_an_invalid_url_generated_by_url_mapper");
	}
}